

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_bufs_wrap_init2(nghttp2_bufs *bufs,nghttp2_vec *vec,size_t veclen,nghttp2_mem *mem)

{
  nghttp2_buf_chain *local_50;
  nghttp2_buf_chain **dst_chain;
  nghttp2_buf_chain *head_chain;
  nghttp2_buf_chain *cur_chain;
  size_t i;
  nghttp2_mem *mem_local;
  size_t veclen_local;
  nghttp2_vec *vec_local;
  nghttp2_bufs *bufs_local;
  
  cur_chain = (nghttp2_buf_chain *)0x0;
  local_50 = (nghttp2_buf_chain *)&dst_chain;
  i = (size_t)mem;
  mem_local = (nghttp2_mem *)veclen;
  veclen_local = (size_t)vec;
  vec_local = (nghttp2_vec *)bufs;
  if (veclen == 0) {
    bufs_local._4_4_ = nghttp2_bufs_wrap_init(bufs,(uint8_t *)0x0,0,mem);
  }
  else {
    dst_chain = (nghttp2_buf_chain **)nghttp2_mem_malloc(mem,veclen * 0x30);
    if (dst_chain == (nghttp2_buf_chain **)0x0) {
      bufs_local._4_4_ = -0x385;
    }
    else {
      for (cur_chain = (nghttp2_buf_chain *)0x0; cur_chain < mem_local;
          cur_chain = (nghttp2_buf_chain *)((long)&cur_chain->next + 1)) {
        head_chain = (nghttp2_buf_chain *)(dst_chain + (long)cur_chain * 6);
        head_chain->next = (nghttp2_buf_chain *)0x0;
        nghttp2_buf_wrap_init
                  (&head_chain->buf,*(uint8_t **)(veclen_local + (long)cur_chain * 0x10),
                   *(size_t *)(veclen_local + (long)cur_chain * 0x10 + 8));
        local_50->next = head_chain;
        local_50 = head_chain;
      }
      vec_local[1].base = (uint8_t *)i;
      vec_local[3].len = 0;
      vec_local->base = (uint8_t *)dst_chain;
      vec_local->len = (size_t)vec_local->base;
      vec_local[1].len = 0;
      vec_local[2].len = (size_t)mem_local;
      vec_local[2].base = (uint8_t *)mem_local;
      vec_local[3].base = (uint8_t *)mem_local;
      bufs_local._4_4_ = 0;
    }
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_bufs_wrap_init2(nghttp2_bufs *bufs, const nghttp2_vec *vec,
                            size_t veclen, nghttp2_mem *mem) {
  size_t i = 0;
  nghttp2_buf_chain *cur_chain;
  nghttp2_buf_chain *head_chain;
  nghttp2_buf_chain **dst_chain = &head_chain;

  if (veclen == 0) {
    return nghttp2_bufs_wrap_init(bufs, NULL, 0, mem);
  }

  head_chain = nghttp2_mem_malloc(mem, sizeof(nghttp2_buf_chain) * veclen);
  if (head_chain == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  for (i = 0; i < veclen; ++i) {
    cur_chain = &head_chain[i];
    cur_chain->next = NULL;
    nghttp2_buf_wrap_init(&cur_chain->buf, vec[i].base, vec[i].len);

    *dst_chain = cur_chain;
    dst_chain = &cur_chain->next;
  }

  bufs->mem = mem;
  bufs->offset = 0;

  bufs->head = head_chain;
  bufs->cur = bufs->head;

  /* We don't use chunk_length since no allocation is expected. */
  bufs->chunk_length = 0;
  bufs->chunk_used = veclen;
  bufs->max_chunk = veclen;
  bufs->chunk_keep = veclen;

  return 0;
}